

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

bool __thiscall
libtorrent::torrent_info::resolve_duplicate_filenames_slow
          (torrent_info *this,int max_duplicate_filenames,error_code *ec)

{
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *crc_00;
  size_type sVar1;
  pointer pcVar2;
  libtorrent *this_00;
  undefined1 auVar3 [8];
  __node_base _Var4;
  undefined4 uVar5;
  size_t sVar6;
  char cVar7;
  bool bVar8;
  file_flags_t fVar9;
  uint h;
  int iVar10;
  uint uVar11;
  value_type remainder;
  uint32_t uVar12;
  long lVar13;
  size_type __bkt_count;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar14;
  int64_t iVar15;
  int64_t iVar16;
  file_index_t fVar17;
  __hash_code __code;
  pointer pbVar18;
  _Hash_node_base *p_Var19;
  torrent_info *ptVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  _Hash_node_base *in_R9;
  file_index_t index;
  uint uVar24;
  ulong uVar25;
  size_type sVar26;
  pointer pbVar27;
  _Hash_node_base *p_Var28;
  value_type remainder_00;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  error_code eVar31;
  string_view str;
  string_view lhs;
  string_view s2;
  string_view str_00;
  string_view rhs;
  string_view s1;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc;
  string other_name;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc_1;
  string base;
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  files;
  string ext;
  string local_168;
  value_type local_144;
  torrent_info *local_140;
  undefined1 local_138 [8];
  uint local_130;
  undefined4 uStack_12c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [3];
  ulong local_f8;
  pointer local_f0;
  uint local_e4;
  string local_e0;
  int local_bc;
  value_type local_b8;
  long local_a8 [2];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_98;
  error_code *local_60;
  pointer local_58;
  string local_50;
  
  local_98._M_buckets = &local_98._M_single_bucket;
  local_98._M_bucket_count = 1;
  local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_element_count = 0;
  local_98._M_rehash_policy._M_max_load_factor = 1.0;
  local_98._M_rehash_policy._M_next_resize = 0;
  local_98._M_single_bucket = (__node_base_ptr)0x0;
  pbVar18 = (this->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar27 = (this->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_bc = max_duplicate_filenames;
  local_60 = ec;
  iVar10 = file_storage::num_files(&this->m_files);
  lVar13 = (long)iVar10 + ((long)pbVar18 - (long)pbVar27 >> 5);
  auVar29._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar29._0_8_ = lVar13;
  auVar29._12_4_ = 0x45300000;
  local_f0 = (pointer)(double)local_98._M_rehash_policy._M_max_load_factor;
  ceil(((auVar29._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) / (double)local_f0);
  sVar6 = local_98._M_rehash_policy._M_next_resize;
  local_138._0_4_ = (undefined4)local_98._M_rehash_policy._M_next_resize;
  local_138._4_4_ = (undefined4)(local_98._M_rehash_policy._M_next_resize >> 0x20);
  lVar13 = local_98._M_element_count + 1;
  auVar30._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar30._0_8_ = lVar13;
  auVar30._12_4_ = 0x45300000;
  ceil(((auVar30._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) / (double)local_f0);
  __bkt_count = ::std::__detail::_Prime_rehash_policy::_M_next_bkt
                          ((ulong)&local_98._M_rehash_policy);
  if (__bkt_count != local_98._M_bucket_count) {
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::_M_rehash(&local_98,__bkt_count,(__rehash_state *)local_138);
    sVar6 = local_98._M_rehash_policy._M_next_resize;
  }
  local_98._M_rehash_policy._M_next_resize = sVar6;
  uVar11 = 0x80000000;
  uVar24 = 1;
  str._M_str._0_4_ = 0xffffffff;
  do {
    str_00._M_str._0_4_ = uVar11 | uVar24;
    uVar22 = (uint)str_00._M_str;
    if (((uint)str_00._M_str & (uint)str._M_str) != uVar24) {
      uVar22 = 0;
    }
    if (((uint)str_00._M_str & (uint)str._M_str) == uVar11) {
      uVar22 = (uint)str_00._M_str;
    }
    str._M_str._0_4_ = (uint)str._M_str ^ uVar22;
    uVar11 = uVar11 >> 1;
    uVar24 = uVar24 * 2;
  } while (uVar24 < uVar11);
  local_168._M_dataplus._M_p._0_4_ = (uint)str._M_str;
  crc_00 = (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
           (this->m_files).m_name._M_string_length;
  if (crc_00 != (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)0x0) {
    str._M_len = (size_t)(this->m_files).m_name._M_dataplus._M_p;
    str._M_str._4_4_ = 0;
    (anonymous_namespace)::
    process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
              ((_anonymous_namespace_ *)&local_168,crc_00,str);
  }
  pbVar18 = (this->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar27 = (this->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_140 = this;
  if (pbVar18 != pbVar27) {
    uVar24 = 0xffffffff;
    local_144 = (uint)local_168._M_dataplus._M_p;
    remainder_00 = (uint)local_168._M_dataplus._M_p;
    local_58 = pbVar27;
    do {
      uVar25 = (ulong)uVar24;
      remainder = remainder_00;
      if (pbVar18->_M_string_length == 0) {
LAB_00363e75:
        local_130 = 0;
      }
      else {
        local_138[0] = 0x2f;
        remainder = boost::detail::reflected_byte_table_driven_crcs<32,_517762881UL>::crc_update
                              (remainder_00,local_138,1);
        sVar1 = pbVar18->_M_string_length;
        remainder_00 = local_144;
        if (sVar1 == 0) goto LAB_00363e75;
        pcVar2 = (pbVar18->_M_dataplus)._M_p;
        sVar26 = 0;
        local_f8 = uVar25;
        local_f0 = pbVar18;
        do {
          cVar7 = pcVar2[sVar26];
          if (cVar7 == '/') {
            local_138._0_4_ = ~remainder;
            local_138._4_4_ = (undefined4)uVar25;
            local_130 = (uint)(uVar25 >> 0x20);
            ::std::
            unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
            ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                      *)&local_98,(value_type *)local_138);
          }
          cVar7 = aux::to_lower(cVar7);
          local_138[0] = cVar7;
          remainder = boost::detail::reflected_byte_table_driven_crcs<32,_517762881UL>::crc_update
                                (remainder,local_138,1);
          sVar26 = sVar26 + 1;
          uVar25 = uVar25 + 0x100000000;
        } while (sVar1 != sVar26);
        local_130 = (uint)local_f0->_M_string_length;
        pbVar18 = local_f0;
        uVar25 = local_f8;
        pbVar27 = local_58;
        remainder_00 = local_144;
      }
      local_138._0_4_ = ~remainder;
      local_130 = local_130 | (uint)(uVar25 >> 0x20);
      local_138._4_4_ = (undefined4)uVar25;
      uVar5 = local_138._4_4_;
      ::std::
      unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
      ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                *)&local_98,(value_type *)local_138);
      uVar24 = uVar5 - 1;
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar27);
  }
  ptVar20 = local_140;
  iVar14 = file_storage::file_range(&local_140->m_files);
  local_f0 = (pointer)((ulong)iVar14 >> 0x20);
  if (iVar14._begin.m_val.m_val == iVar14._end.m_val.m_val) {
LAB_00363ec9:
    bVar8 = true;
    _Var4._M_nxt = local_98._M_before_begin._M_nxt;
joined_r0x00363edf:
    while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
      p_Var28 = (_Var4._M_nxt)->_M_nxt;
      operator_delete(_Var4._M_nxt,0x18);
      _Var4._M_nxt = p_Var28;
    }
    memset(local_98._M_buckets,0,local_98._M_bucket_count << 3);
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_98._M_element_count = 0;
    if (&local_98._M_single_bucket != local_98._M_buckets) {
      operator_delete(local_98._M_buckets,local_98._M_bucket_count << 3);
    }
    return bVar8;
  }
  local_f8 = local_f8 & 0xffffffff00000000;
LAB_00363f61:
  local_138 = (undefined1  [8])local_128;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  index.m_val = (int)iVar14._begin.m_val;
  uVar12 = file_storage::file_path_hash(&ptVar20->m_files,index,(string *)local_138);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,local_128[0]._M_allocated_capacity + 1);
  }
  if (local_98._M_buckets[(ulong)uVar12 % local_98._M_bucket_count] != (__node_base_ptr)0x0) {
    p_Var28 = local_98._M_buckets[(ulong)uVar12 % local_98._M_bucket_count]->_M_nxt;
    uVar24 = *(uint *)&p_Var28[1]._M_nxt;
    do {
      p_Var19 = p_Var28;
      if (uVar24 == uVar12) goto LAB_00364004;
      p_Var28 = p_Var28->_M_nxt;
    } while ((p_Var28 != (_Hash_node_base *)0x0) &&
            (uVar24 = *(uint *)&p_Var28[1]._M_nxt,
            (ulong)uVar24 % local_98._M_bucket_count == (ulong)uVar12 % local_98._M_bucket_count));
  }
  goto LAB_003643c8;
  while (*(uint32_t *)&p_Var19[1]._M_nxt == uVar12) {
LAB_00364004:
    p_Var19 = p_Var19->_M_nxt;
    if (p_Var19 == (_Hash_node_base *)0x0) break;
  }
  do {
    if (p_Var28 == p_Var19) break;
    fVar17.m_val = (int)*(undefined8 *)((long)&p_Var28[1]._M_nxt + 4);
    if (fVar17.m_val < 0) {
      pcVar2 = (local_140->m_files).m_name._M_dataplus._M_p;
      this_00 = (libtorrent *)(local_140->m_files).m_name._M_string_length;
      ::std::__cxx11::string::substr
                ((ulong)&local_168,
                 (ulong)((local_140->m_files).m_paths.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (~fVar17.m_val & 0x7fffffff)));
      lhs._M_str = (char *)local_168._M_string_length;
      lhs._M_len = (size_t)pcVar2;
      rhs._M_str = (char *)in_R9;
      rhs._M_len = (size_t)local_168._M_dataplus._M_p;
      combine_path_abi_cxx11_((string *)local_138,this_00,lhs,rhs);
      auVar3 = local_138;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_003640bb;
    }
    else {
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      file_storage::file_path((string *)local_138,&local_140->m_files,fVar17,&local_168);
      auVar3 = local_138;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
LAB_003640bb:
        operator_delete(local_168._M_dataplus._M_p,
                        CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                 local_168.field_2._M_local_buf[0]) + 1);
        auVar3 = local_138;
      }
    }
    s1._M_len._4_4_ = uStack_12c;
    s1._M_len._0_4_ = local_130;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_138 = auVar3;
    file_storage::file_path(&local_168,&local_140->m_files,index,&local_e0);
    s2._M_str = local_168._M_dataplus._M_p;
    s2._M_len = local_168._M_string_length;
    s1._M_str = (char *)auVar3;
    bVar8 = aux::string_equal_no_case(s1,s2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,local_128[0]._M_allocated_capacity + 1);
    }
    if (bVar8) break;
    p_Var28 = p_Var28->_M_nxt;
  } while( true );
  ptVar20 = local_140;
  if (p_Var28 != p_Var19) {
    fVar17.m_val = *(int *)((long)&p_Var28[1]._M_nxt + 4);
    if (-1 < fVar17.m_val) {
      fVar9 = file_storage::file_flags(&local_140->m_files,index);
      if ((fVar9.m_val & 1) != 0) {
        fVar9 = file_storage::file_flags(&ptVar20->m_files,fVar17);
        if ((fVar9.m_val & 1) != 0) {
          iVar15 = file_storage::file_size(&ptVar20->m_files,index);
          iVar16 = file_storage::file_size(&ptVar20->m_files,fVar17);
          if (iVar15 == iVar16) goto LAB_003644a3;
        }
      }
    }
    local_138 = (undefined1  [8])local_128;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
    file_storage::file_path(&local_168,&ptVar20->m_files,index,(string *)local_138);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,local_128[0]._M_allocated_capacity + 1);
    }
    remove_extension(&local_e0,&local_168);
    extension(&local_50,&local_168);
    iVar10 = local_bc;
    if (local_bc < (int)local_f8) {
      iVar10 = (int)local_f8;
    }
    local_144 = iVar10 + 1;
    uVar11 = iVar10 - (int)local_f8;
    uVar24 = 0;
    do {
      snprintf(local_138,0x32,".%d%s",(ulong)(uVar24 + 1),local_50._M_dataplus._M_p);
      local_b8._0_8_ = local_a8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      ::std::__cxx11::string::append((char *)&local_b8);
      ::std::__cxx11::string::operator=((string *)&local_168,(string *)&local_b8);
      if ((long *)local_b8._0_8_ != local_a8) {
        operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
      }
      ptVar20 = local_140;
      uVar22 = 0x80000000;
      str._M_str._0_4_ = 1;
      str_00._M_str._0_4_ = 0xffffffff;
      do {
        uVar21 = uVar22 | (uint)str._M_str;
        uVar23 = uVar21;
        if ((uVar21 & (uint)str_00._M_str) != (uint)str._M_str) {
          uVar23 = 0;
        }
        if ((uVar21 & (uint)str_00._M_str) == uVar22) {
          uVar23 = uVar21;
        }
        str_00._M_str._0_4_ = (uint)str_00._M_str ^ uVar23;
        uVar22 = uVar22 >> 1;
        str._M_str._0_4_ = (uint)str._M_str * 2;
      } while ((uint)str._M_str < uVar22);
      str_00._M_len = (size_t)local_168._M_dataplus._M_p;
      str_00._M_str._4_4_ = 0;
      local_e4 = (uint)str_00._M_str;
      (anonymous_namespace)::
      process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
                ((_anonymous_namespace_ *)&local_e4,
                 (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
                 local_168._M_string_length,str_00);
      str._M_str._0_4_ = ~local_e4;
      if (local_98._M_buckets[(ulong)(uint)str._M_str % local_98._M_bucket_count] ==
          (__node_base_ptr)0x0) {
LAB_003643ef:
        local_b8.second.length = 0;
        local_b8.first = (uint)str._M_str;
        local_b8.second.idx.m_val = index.m_val;
        ::std::
        unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
        ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                  *)&local_98,&local_b8);
        copy_on_write(ptVar20);
        bVar8 = true;
        file_storage::rename_file(&ptVar20->m_files,index,&local_168);
        goto LAB_00364439;
      }
      in_R9 = local_98._M_buckets[(ulong)(uint)str._M_str % local_98._M_bucket_count]->_M_nxt;
      uVar22 = *(uint *)&in_R9[1]._M_nxt;
      while (uVar22 != (uint)str._M_str) {
        in_R9 = in_R9->_M_nxt;
        if ((in_R9 == (_Hash_node_base *)0x0) ||
           (uVar22 = *(uint *)&in_R9[1]._M_nxt,
           (ulong)uVar22 % local_98._M_bucket_count !=
           (ulong)(uint)str._M_str % local_98._M_bucket_count)) goto LAB_003643ef;
      }
      if (uVar24 == uVar11) goto LAB_003644b6;
      local_f8 = CONCAT44(local_f8._4_4_,(int)local_f8 + 1);
      uVar24 = uVar24 + 1;
    } while( true );
  }
LAB_003643c8:
  local_130 = 0;
  local_138._0_4_ = uVar12;
  local_138._4_4_ = index.m_val;
  ::std::
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
            *)&local_98,(value_type *)local_138);
  goto LAB_003644a3;
LAB_003644b6:
  eVar31 = errors::make_error_code(too_many_duplicate_filenames);
  local_60->val_ = eVar31.val_;
  local_60->failed_ = eVar31.failed_;
  *(int3 *)&local_60->field_0x5 = eVar31._5_3_;
  local_60->cat_ = eVar31.cat_;
  (ptVar20->m_files).m_piece_length = 0;
  bVar8 = false;
  local_f8 = CONCAT44(local_f8._4_4_,local_144);
LAB_00364439:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  ptVar20 = local_140;
  if (!bVar8) {
    bVar8 = false;
    _Var4._M_nxt = local_98._M_before_begin._M_nxt;
    goto joined_r0x00363edf;
  }
LAB_003644a3:
  iVar14._begin.m_val = index.m_val + 1;
  iVar14._end.m_val = 0;
  if (iVar14._begin.m_val == (uint)local_f0) goto LAB_00363ec9;
  goto LAB_00363f61;
}

Assistant:

bool torrent_info::resolve_duplicate_filenames_slow(
		int const max_duplicate_filenames, error_code& ec)
	{
		INVARIANT_CHECK;

		// maps filename hash to file index
		// or, if the file_index is negative, maps into the paths vector
		std::unordered_multimap<std::uint32_t, name_entry> files;

		std::vector<std::string> const& paths = m_files.paths();
		files.reserve(paths.size() + aux::numeric_cast<std::size_t>(m_files.num_files()));

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		{
			boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
			if (!m_files.name().empty())
			{
				process_string_lowercase(crc, m_files.name());
			}
			file_index_t path_index{-1};
			for (auto const& path : paths)
			{
				auto local_crc = crc;
				if (!path.empty()) local_crc.process_byte(TORRENT_SEPARATOR);
				int count = 0;
				for (char const c : path)
				{
					if (c == TORRENT_SEPARATOR)
						files.insert({local_crc.checksum(), {path_index, count}});
					local_crc.process_byte(aux::to_lower(c) & 0xff);
					++count;
				}
				files.insert({local_crc.checksum(), {path_index, int(path.size())}});
				--path_index;
			}
		}

		// keep track of the total number of name collisions. If there are too
		// many, it's probably a malicious torrent and we should just fail
		int num_collisions = 0;
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const hash = m_files.file_path_hash(i, "");
			auto range = files.equal_range(hash);
			auto const match = std::find_if(range.first, range.second, [&](std::pair<std::uint32_t, name_entry> const& o)
			{
				std::string const other_name = o.second.idx < file_index_t{}
					? combine_path(m_files.name(), paths[std::size_t(-static_cast<int>(o.second.idx)-1)].substr(0, std::size_t(o.second.length)))
					: m_files.file_path(o.second.idx);
				return aux::string_equal_no_case(other_name, m_files.file_path(i));
			});

			if (match == range.second)
			{
				files.insert({hash, {i, 0}});
				continue;
			}

			// pad files are allowed to collide with each-other, as long as they have
			// the same size.
			file_index_t const other_idx = match->second.idx;
			if (other_idx >= file_index_t{}
				&& (m_files.file_flags(i) & file_storage::flag_pad_file)
				&& (m_files.file_flags(other_idx) & file_storage::flag_pad_file)
				&& m_files.file_size(i) == m_files.file_size(other_idx))
				continue;

			std::string filename = m_files.file_path(i);
			std::string base = remove_extension(filename);
			std::string ext = extension(filename);
			int cnt = 0;
			for (;;)
			{
				++cnt;
				char new_ext[50];
				std::snprintf(new_ext, sizeof(new_ext), ".%d%s", cnt, ext.c_str());
				filename = base + new_ext;

				boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
				process_string_lowercase(crc, filename);
				std::uint32_t const new_hash = crc.checksum();
				if (files.find(new_hash) == files.end())
				{
					files.insert({new_hash, {i, 0}});
					break;
				}
				++num_collisions;
				if (num_collisions > max_duplicate_filenames)
				{
					ec = errors::too_many_duplicate_filenames;
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}
			}

			copy_on_write();
			m_files.rename_file(i, filename);
		}
		return true;
	}